

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::addTexture
          (SRGBTestCase *this,TextureType targetType,int width,int height,Vec4 *color,WrapMode wrapS
          ,WrapMode wrapT,FilterMode minFilter,FilterMode magFilter,SRGBDecode decoding)

{
  Context *context;
  int height_00;
  int width_00;
  int targetType_00;
  SRGBTestTexture *this_00;
  Vector<float,_4> local_68;
  TextureFormat local_58;
  SRGBTestTexture *local_50;
  SRGBTestTexture *texture;
  Vec4 *pVStack_40;
  WrapMode wrapS_local;
  Vec4 *color_local;
  int local_30;
  int height_local;
  int width_local;
  TextureType targetType_local;
  SRGBTestCase *this_local;
  
  texture._4_4_ = wrapS;
  pVStack_40 = color;
  color_local._4_4_ = height;
  local_30 = width;
  height_local = targetType;
  _width_local = this;
  this_00 = (SRGBTestTexture *)operator_new(0xb8);
  targetType_00 = height_local;
  width_00 = local_30;
  height_00 = color_local._4_4_;
  context = (this->super_TestCase).m_context;
  local_58 = this->m_internalFormat;
  tcu::Vector<float,_4>::Vector(&local_68,color);
  SRGBTestTexture::SRGBTestTexture
            (this_00,context,targetType_00,local_58,width_00,height_00,&local_68,texture._4_4_,wrapT
             ,minFilter,magFilter,decoding);
  local_50 = this_00;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
  ::push_back(&this->m_textureSourceList,&local_50);
  return;
}

Assistant:

void SRGBTestCase::addTexture (	const glu::TextureTestUtil::TextureType	targetType,
								const int								width,
								const int								height,
								const tcu::Vec4							color,
								const tcu::Sampler::WrapMode			wrapS,
								const tcu::Sampler::WrapMode			wrapT,
								const tcu::Sampler::FilterMode			minFilter,
								const tcu::Sampler::FilterMode			magFilter,
								const SRGBDecode						decoding)
{
	SRGBTestTexture* texture = new SRGBTestTexture(m_context, targetType, m_internalFormat, width, height, color, wrapS, wrapT, minFilter, magFilter, decoding);
	m_textureSourceList.push_back(texture);
}